

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocator.cpp
# Opt level: O0

void __thiscall
xscript::parser::register_allocator::register_allocator(register_allocator *this,int32_t max)

{
  int local_18;
  int local_14;
  int32_t i;
  int32_t max_local;
  register_allocator *this_local;
  
  local_14 = max;
  _i = this;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)this);
  local_18 = local_14;
  if (local_14 < 1) {
    __assert_fail("max > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/register_allocator.cpp"
                  ,0xb,"xscript::parser::register_allocator::register_allocator(int32_t)");
  }
  while (local_18 = local_18 + -1, -1 < local_18) {
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->regs,&local_18);
  }
  return;
}

Assistant:

register_allocator::register_allocator(int32_t max) {
    assert(max > 0);
    
    for (int32_t i = max-1 ; i >= 0 ; i--) {
        regs.push(i);
    }
}